

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_zip_mac_metadata.c
# Opt level: O2

void test_read_format_zip_mac_metadata(void)

{
  wchar_t wVar1;
  int iVar2;
  mode_t mVar3;
  char *buff;
  archive *a;
  char *pcVar4;
  void *_v1;
  archive_entry *ae;
  size_t s;
  uchar appledouble [287];
  
  memcpy(appledouble,&DAT_002a8a50,0x11f);
  extract_reference_file("test_read_format_zip_mac_metadata.zip");
  buff = slurpfile(&s,"%s","test_read_format_zip_mac_metadata.zip");
  a = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_mac_metadata.c"
                   ,L'Q',(uint)(a != (archive *)0x0),"(a = archive_read_new()) != NULL",(void *)0x0)
  ;
  wVar1 = archive_read_support_format_zip(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_mac_metadata.c"
                      ,L'R',0,"ARCHIVE_OK",(long)wVar1,"archive_read_support_format_zip(a)",a);
  iVar2 = archive_read_set_option(a,"zip","mac-ext","1");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_mac_metadata.c"
                      ,L'S',0,"ARCHIVE_OK",(long)iVar2,
                      "archive_read_set_option(a, \"zip\", \"mac-ext\", \"1\")",a);
  iVar2 = read_open_memory_seek(a,buff,s,1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_mac_metadata.c"
                      ,L'T',0,"ARCHIVE_OK",(long)iVar2,"read_open_memory_seek(a, p, s, 1)",a);
  pcVar4 = archive_zlib_version();
  iVar2 = archive_read_next_header(a,&ae);
  if (pcVar4 == (char *)0x0) {
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_mac_metadata.c"
                        ,L'[',-0x14,"ARCHIVE_WARN",(long)iVar2,"archive_read_next_header(a, &ae)",a)
    ;
    pcVar4 = archive_error_string(a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_mac_metadata.c"
               ,L']',pcVar4,"archive_error_string(a)",
               "Unsupported ZIP compression method (deflation)",
               "\"Unsupported ZIP compression method (deflation)\"",(void *)0x0,L'\0');
    iVar2 = archive_errno(a);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_mac_metadata.c"
                     ,L'^',(uint)(iVar2 != 0),"archive_errno(a) != 0",(void *)0x0);
  }
  else {
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_mac_metadata.c"
                        ,L'X',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header(a, &ae)",a);
  }
  wVar1 = archive_entry_is_encrypted(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_mac_metadata.c"
                      ,L'`',(long)wVar1,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar2 = archive_read_has_encrypted_entries(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_mac_metadata.c"
                      ,L'a',(long)iVar2,"archive_read_has_encrypted_entries(a)",0,"0",a);
  pcVar4 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_mac_metadata.c"
             ,L'b',"file3","\"file3\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar3 = archive_entry_mode(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_mac_metadata.c"
                      ,L'c',0x81a4,"AE_IFREG | 0644",(ulong)mVar3,"archive_entry_mode(ae)",
                      (void *)0x0);
  failure("Mac metadata should be set");
  pcVar4 = archive_zlib_version();
  _v1 = archive_entry_mac_metadata(ae,&s);
  if (pcVar4 == (char *)0x0) {
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_mac_metadata.c"
                     ,L'm',(uint)(_v1 == (void *)0x0),"archive_entry_mac_metadata(ae, &s) == NULL",
                     (void *)0x0);
  }
  else {
    wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_mac_metadata.c"
                             ,L'h',(uint)(_v1 != (void *)0x0),
                             "(metadata = archive_entry_mac_metadata(ae, &s)) != NULL",(void *)0x0);
    if (wVar1 != L'\0') {
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_mac_metadata.c"
                          ,L'j',_v1,"metadata",appledouble,"appledouble",0x11f,"sizeof(appledouble)"
                          ,(void *)0x0);
    }
  }
  iVar2 = archive_read_next_header(a,&ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_mac_metadata.c"
                      ,L'o',1,"ARCHIVE_EOF",(long)iVar2,"archive_read_next_header(a, &ae)",a);
  iVar2 = archive_read_close(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_mac_metadata.c"
                      ,L'p',0,"ARCHIVE_OK",(long)iVar2,"archive_read_close(a)",a);
  iVar2 = archive_read_free(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_mac_metadata.c"
                      ,L'q',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",a);
  free(buff);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_zip_mac_metadata)
{
	const char *refname = "test_read_format_zip_mac_metadata.zip";
	char *p;
	size_t s;
	struct archive *a;
	struct archive_entry *ae;
	const unsigned char appledouble[] = {
		0x00, 0x05, 0x16, 0x07, 0x00, 0x02, 0x00, 0x00,
		0x4d, 0x61, 0x63, 0x20, 0x4f, 0x53, 0x20, 0x58,
		0x20, 0x20, 0x20, 0x20, 0x20, 0x20, 0x20, 0x20,
		0x00, 0x02, 0x00, 0x00, 0x00, 0x09, 0x00, 0x00,
		0x00, 0x32, 0x00, 0x00, 0x00, 0xed, 0x00, 0x00,
		0x00, 0x02, 0x00, 0x00, 0x01, 0x1f, 0x00, 0x00,
		0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
		0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
		0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
		0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
		0x00, 0x00, 0x00, 0x00, 0x41, 0x54, 0x54, 0x52,
		0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01, 0x1f,
		0x00, 0x00, 0x00, 0x98, 0x00, 0x00, 0x00, 0x87,
		0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
		0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
		0x00, 0x00, 0x00, 0x98, 0x00, 0x00, 0x00, 0x87,
		0x00, 0x00, 0x13, 0x63, 0x6f, 0x6d, 0x2e, 0x61,
		0x70, 0x70, 0x6c, 0x65, 0x2e, 0x61, 0x63, 0x6c,
		0x2e, 0x74, 0x65, 0x78, 0x74, 0x00, 0x00, 0x00,
		0x21, 0x23, 0x61, 0x63, 0x6c, 0x20, 0x31, 0x0a,
		0x75, 0x73, 0x65, 0x72, 0x3a, 0x46, 0x46, 0x46,
		0x46, 0x45, 0x45, 0x45, 0x45, 0x2d, 0x44, 0x44,
		0x44, 0x44, 0x2d, 0x43, 0x43, 0x43, 0x43, 0x2d,
		0x42, 0x42, 0x42, 0x42, 0x2d, 0x41, 0x41, 0x41,
		0x41, 0x30, 0x30, 0x30, 0x30, 0x30, 0x30, 0x43,
		0x39, 0x3a, 0x47, 0x75, 0x65, 0x73, 0x74, 0x3a,
		0x32, 0x30, 0x31, 0x3a, 0x64, 0x65, 0x6e, 0x79,
		0x3a, 0x72, 0x65, 0x61, 0x64, 0x0a, 0x67, 0x72,
		0x6f, 0x75, 0x70, 0x3a, 0x41, 0x42, 0x43, 0x44,
		0x45, 0x46, 0x41, 0x42, 0x2d, 0x43, 0x44, 0x45,
		0x46, 0x2d, 0x41, 0x42, 0x43, 0x44, 0x2d, 0x45,
		0x46, 0x41, 0x42, 0x2d, 0x43, 0x44, 0x45, 0x46,
		0x30, 0x30, 0x30, 0x30, 0x30, 0x30, 0x35, 0x30,
		0x3a, 0x61, 0x64, 0x6d, 0x69, 0x6e, 0x3a, 0x38,
		0x30, 0x3a, 0x61, 0x6c, 0x6c, 0x6f, 0x77, 0x3a,
		0x77, 0x72, 0x69, 0x74, 0x65, 0x0a, 0x00
	};

	extract_reference_file(refname);
	p = slurpfile(&s, "%s", refname);

	/* Mac metadata can only be extracted with the seeking reader. */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_zip(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_set_option(a, "zip", "mac-ext", "1"));
	assertEqualIntA(a, ARCHIVE_OK, read_open_memory_seek(a, p, s, 1));

	if (archive_zlib_version() != NULL) {
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_next_header(a, &ae));
	} else {
		assertEqualIntA(a, ARCHIVE_WARN,
		    archive_read_next_header(a, &ae));
		assertEqualString(archive_error_string(a),
		    "Unsupported ZIP compression method (deflation)");
		assert(archive_errno(a) != 0);
	}
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);
	assertEqualString("file3", archive_entry_pathname(ae));
	assertEqualInt(AE_IFREG | 0644, archive_entry_mode(ae));
	failure("Mac metadata should be set");
	if (archive_zlib_version() != NULL) {
		const void *metadata;
		if (assert((metadata = archive_entry_mac_metadata(ae, &s))
		    != NULL)) {
			assertEqualMem(metadata, appledouble,
			    sizeof(appledouble));
		}
	} else {
		assert(archive_entry_mac_metadata(ae, &s) == NULL);
	}
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_free(a));

	free(p);
}